

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall
kj::Path::evalImpl(Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path)

{
  String *pSVar1;
  String *pSVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ArrayDisposer *pAVar7;
  char *pcVar8;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  
  pcVar3 = path.content.ptr;
  pcVar4 = pcVar3;
  if (pcVar3 < (char *)0x2) {
    pcVar8 = (char *)0xffffffffffffffff;
    if (pcVar3 == (char *)0x1) {
      pcVar6 = (char *)0x0;
      goto LAB_00209f43;
    }
  }
  else {
    if (*(char *)&(parts->builder).ptr == '/') {
      ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
    }
    pcVar8 = pcVar3 + -1;
  }
  pcVar6 = (char *)0x0;
  pcVar5 = (char *)0x0;
  do {
    if (pcVar5[(long)&parts->builder] == '/') {
      part.size_ = (size_t)pcVar4;
      part.ptr = pcVar5 + -(long)pcVar6;
      evalPart(this,(Vector<kj::String> *)(pcVar6 + (long)&parts->builder),part);
      pcVar6 = pcVar5 + 1;
    }
    pcVar5 = pcVar5 + 1;
  } while (pcVar5 != pcVar8);
LAB_00209f43:
  part_00.ptr = pcVar3 + ~(ulong)pcVar6;
  part_00.size_ = (size_t)pcVar4;
  evalPart(this,(Vector<kj::String> *)(pcVar6 + (long)&parts->builder),part_00);
  pAVar7 = (ArrayDisposer *)(this->parts).size_;
  if (pAVar7 != (this->parts).disposer) {
    Vector<kj::String>::setCapacity
              ((Vector<kj::String> *)this,
               ((long)pAVar7 - (long)(this->parts).ptr >> 3) * -0x5555555555555555);
    pAVar7 = (ArrayDisposer *)(this->parts).size_;
  }
  pSVar1 = (this->parts).ptr;
  pSVar2 = this[1].parts.ptr;
  (this->parts).ptr = (String *)0x0;
  (this->parts).size_ = 0;
  (this->parts).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar1;
  (__return_storage_ptr__->parts).size_ = ((long)pAVar7 - (long)pSVar1 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)pSVar2;
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalImpl(Vector<String>&& parts, StringPtr path) {
  if (path.startsWith("/")) {
    parts.clear();
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '/') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}